

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

int __thiscall
jrtplib::RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::
DeleteElement(RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this
             ,in6_addr *elem)

{
  int status;
  in6_addr *elem_local;
  RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317> *this_local;
  
  this_local._4_4_ = GotoElement(this,elem);
  if (-1 < this_local._4_4_) {
    this_local._4_4_ = DeleteCurrentElement(this);
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::DeleteElement(const Element &elem)
{
	int status;

	status = GotoElement(elem);
	if (status < 0)
		return status;
	return DeleteCurrentElement();
}